

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_flattener.h
# Opt level: O0

void __thiscall
mp::
ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::ConvertSOSConstraints
          (ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *this)

{
  StringRef nm;
  StringRef nm_00;
  StringRef nm_01;
  StringRef nm_02;
  bool bVar1;
  int iVar2;
  ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_RDI;
  bool in_stack_000000af;
  ArrayRef<double> *in_stack_000000b0;
  ArrayRef<int> *in_stack_000000b8;
  ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_stack_000000c0;
  ArrayRef<double> sosref;
  ArrayRef<int> sos;
  ArrayRef<double> ref;
  ArrayRef<int> sosno;
  undefined4 in_stack_fffffffffffffc88;
  int in_stack_fffffffffffffc8c;
  SuffixDef<double> *in_stack_fffffffffffffc90;
  ArrayRef<double> *this_00;
  undefined8 in_stack_fffffffffffffc98;
  undefined6 in_stack_fffffffffffffca0;
  undefined1 in_stack_fffffffffffffca6;
  undefined1 in_stack_fffffffffffffca7;
  ArrayRef<double> local_2d0;
  string local_2a8 [32];
  int *in_stack_fffffffffffffd78;
  SuffixDef<double> *in_stack_fffffffffffffd80;
  BasicProblem<mp::BasicProblemParams<int>_> *in_stack_fffffffffffffd88;
  SuffixDef<int> *in_stack_fffffffffffffdb0;
  BasicProblem<mp::BasicProblemParams<int>_> *in_stack_fffffffffffffdb8;
  string local_218 [224];
  string local_138 [160];
  string local_98 [152];
  
  iVar2 = ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
          ::sos(in_RDI);
  if (iVar2 != 0) {
    (*(in_RDI->
      super_ExprConverter<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
      ).
      super_ExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
      .
      super_BasicExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr,_mp::internal::ExprTypes>
      ._vptr_BasicExprVisitor[0x12])();
    fmt::BasicStringRef<char>::BasicStringRef
              (&in_stack_fffffffffffffc90->name_,
               (char *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    std::__cxx11::string::string(local_98);
    nm.size_._0_6_ = in_stack_fffffffffffffca0;
    nm.data_ = (char *)in_stack_fffffffffffffc98;
    nm.size_._6_1_ = in_stack_fffffffffffffca6;
    nm.size_._7_1_ = in_stack_fffffffffffffca7;
    SuffixDef<int>::SuffixDef
              ((SuffixDef<int> *)in_stack_fffffffffffffc90,nm,in_stack_fffffffffffffc8c,
               (SuffixTable *)0x611c5a);
    BasicProblem<mp::BasicProblemParams<int>_>::ReadIntSuffix
              (in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
    SuffixDef<int>::~SuffixDef((SuffixDef<int> *)0x611c85);
    std::__cxx11::string::~string(local_98);
    (*(in_RDI->
      super_ExprConverter<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
      ).
      super_ExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
      .
      super_BasicExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr,_mp::internal::ExprTypes>
      ._vptr_BasicExprVisitor[0x12])();
    fmt::BasicStringRef<char>::BasicStringRef
              (&in_stack_fffffffffffffc90->name_,
               (char *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    std::__cxx11::string::string(local_138);
    nm_00.size_._0_6_ = in_stack_fffffffffffffca0;
    nm_00.data_ = (char *)in_stack_fffffffffffffc98;
    nm_00.size_._6_1_ = in_stack_fffffffffffffca6;
    nm_00.size_._7_1_ = in_stack_fffffffffffffca7;
    SuffixDef<double>::SuffixDef
              (in_stack_fffffffffffffc90,nm_00,in_stack_fffffffffffffc8c,(SuffixTable *)0x611cf6);
    BasicProblem<mp::BasicProblemParams<int>_>::ReadDblSuffix
              (in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
    SuffixDef<double>::~SuffixDef((SuffixDef<double> *)0x611d25);
    std::__cxx11::string::~string(local_138);
    bVar1 = mp::ArrayRef::operator_cast_to_bool((ArrayRef<int> *)0x611d3f);
    if ((bVar1) &&
       (bVar1 = mp::ArrayRef::operator_cast_to_bool((ArrayRef<double> *)0x611d5f), bVar1)) {
      ArrayRef<int>::ArrayRef
                ((ArrayRef<int> *)in_stack_fffffffffffffc90,
                 (ArrayRef<int> *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      ArrayRef<double>::ArrayRef
                ((ArrayRef<double> *)in_stack_fffffffffffffc90,
                 (ArrayRef<double> *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      ConvertSOSCollection(in_stack_000000c0,in_stack_000000b8,in_stack_000000b0,in_stack_000000af);
      ArrayRef<double>::~ArrayRef((ArrayRef<double> *)0x611dcb);
      ArrayRef<int>::~ArrayRef((ArrayRef<int> *)0x611dd8);
    }
    ArrayRef<double>::~ArrayRef((ArrayRef<double> *)0x611ed8);
    ArrayRef<int>::~ArrayRef((ArrayRef<int> *)0x611ee5);
  }
  iVar2 = sos2_ampl_pl(in_RDI);
  if (iVar2 != 0) {
    (*(in_RDI->
      super_ExprConverter<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
      ).
      super_ExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
      .
      super_BasicExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr,_mp::internal::ExprTypes>
      ._vptr_BasicExprVisitor[0x12])();
    fmt::BasicStringRef<char>::BasicStringRef
              (&in_stack_fffffffffffffc90->name_,
               (char *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    std::__cxx11::string::string(local_218);
    nm_01.size_._0_6_ = in_stack_fffffffffffffca0;
    nm_01.data_ = (char *)in_stack_fffffffffffffc98;
    nm_01.size_._6_1_ = in_stack_fffffffffffffca6;
    nm_01.size_._7_1_ = in_stack_fffffffffffffca7;
    SuffixDef<int>::SuffixDef
              ((SuffixDef<int> *)in_stack_fffffffffffffc90,nm_01,in_stack_fffffffffffffc8c,
               (SuffixTable *)0x611f79);
    BasicProblem<mp::BasicProblemParams<int>_>::ReadIntSuffix
              (in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
    SuffixDef<int>::~SuffixDef((SuffixDef<int> *)0x611fa4);
    std::__cxx11::string::~string(local_218);
    (*(in_RDI->
      super_ExprConverter<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
      ).
      super_ExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
      .
      super_BasicExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr,_mp::internal::ExprTypes>
      ._vptr_BasicExprVisitor[0x12])();
    fmt::BasicStringRef<char>::BasicStringRef
              (&in_stack_fffffffffffffc90->name_,
               (char *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    std::__cxx11::string::string(local_2a8);
    nm_02.size_._0_6_ = in_stack_fffffffffffffca0;
    nm_02.data_ = (char *)in_stack_fffffffffffffc98;
    nm_02.size_._6_1_ = in_stack_fffffffffffffca6;
    nm_02.size_._7_1_ = in_stack_fffffffffffffca7;
    SuffixDef<double>::SuffixDef
              (in_stack_fffffffffffffc90,nm_02,in_stack_fffffffffffffc8c,(SuffixTable *)0x612015);
    BasicProblem<mp::BasicProblemParams<int>_>::ReadDblSuffix
              (in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
    SuffixDef<double>::~SuffixDef((SuffixDef<double> *)0x612044);
    std::__cxx11::string::~string(local_2a8);
    bVar1 = mp::ArrayRef::operator_cast_to_bool((ArrayRef<int> *)0x61205e);
    if ((bVar1) &&
       (bVar1 = mp::ArrayRef::operator_cast_to_bool((ArrayRef<double> *)0x61207e), bVar1)) {
      this_00 = &local_2d0;
      ArrayRef<int>::ArrayRef
                ((ArrayRef<int> *)this_00,
                 (ArrayRef<int> *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      ArrayRef<double>::ArrayRef
                (this_00,(ArrayRef<double> *)
                         CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      ConvertSOSCollection(in_stack_000000c0,in_stack_000000b8,in_stack_000000b0,in_stack_000000af);
      ArrayRef<double>::~ArrayRef((ArrayRef<double> *)0x6120ed);
      ArrayRef<int>::~ArrayRef((ArrayRef<int> *)0x6120fa);
    }
    ArrayRef<double>::~ArrayRef((ArrayRef<double> *)0x6121fa);
    ArrayRef<int>::~ArrayRef((ArrayRef<int> *)0x612207);
  }
  return;
}

Assistant:

void ConvertSOSConstraints() {
    if (sos()) {
      auto sosno = GetModel().
          ReadIntSuffix( { "sosno", suf::Kind::VAR } );
      auto ref = GetModel().
          ReadDblSuffix( { "ref", suf::Kind::VAR } );
      if (sosno && ref)
        MP_DISPATCH( ConvertSOSCollection(sosno, ref, false) );
    }
    if (sos2_ampl_pl()) {
      auto sos = GetModel().
          ReadIntSuffix( { "sos", suf::Kind::VAR } );
      auto sosref = GetModel().
          ReadDblSuffix( { "sosref", suf::Kind::VAR } );
      if (sos && sosref)
        MP_DISPATCH( ConvertSOSCollection(sos, sosref, true) );
    }
  }